

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::DeleteLogDestinations(void)

{
  LogDestination *this;
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *pvVar1;
  MutexLock local_18;
  MutexLock l;
  int severity;
  
  for (l.mu_._4_4_ = 0; l.mu_._4_4_ < 4; l.mu_._4_4_ = l.mu_._4_4_ + 1) {
    this = *(LogDestination **)(log_destinations_ + (long)l.mu_._4_4_ * 8);
    if (this != (LogDestination *)0x0) {
      ~LogDestination(this);
      operator_delete(this,0xe0);
    }
    *(undefined8 *)(log_destinations_ + (long)l.mu_._4_4_ * 8) = 0;
  }
  ::glog_internal_namespace_::MutexLock::MutexLock(&local_18,(Mutex *)sink_mutex_);
  pvVar1 = sinks_;
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::~vector(sinks_);
    operator_delete(pvVar1,0x18);
  }
  sinks_ = (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0;
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

void LogDestination::DeleteLogDestinations() {
  for (int severity = 0; severity < NUM_SEVERITIES; ++severity) {
    delete log_destinations_[severity];
    log_destinations_[severity] = NULL;
  }
  MutexLock l(&sink_mutex_);
  delete sinks_;
  sinks_ = NULL;
}